

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroupCollection::AppendRowGroup(RowGroupCollection *this,SegmentLock *l,idx_t start_row)

{
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *in_RSI;
  vector<duckdb::LogicalType,_true> *in_RDI;
  RowGroup *unaff_retaddr;
  templated_unique_single_t new_row_group;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
  *in_stack_ffffffffffffff88;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *in_stack_ffffffffffffff90;
  RowGroupCollection *in_stack_ffffffffffffffb8;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
  *in_stack_ffffffffffffffc0;
  SegmentLock *in_stack_ffffffffffffffc8;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_ffffffffffffffd0;
  unsigned_long local_20 [2];
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *local_10;
  
  local_10 = in_RSI;
  make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,unsigned_long&,unsigned_int>
            (in_stack_ffffffffffffffb8,local_20,(uint *)in_RDI);
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
             in_stack_ffffffffffffff90);
  RowGroup::InitializeEmpty(unaff_retaddr,in_RDI);
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(in_stack_ffffffffffffff90);
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::unique_ptr
            (local_10,in_stack_ffffffffffffff88);
  SegmentTree<duckdb::RowGroup,_true>::AppendSegment
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::~unique_ptr
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)0xbadd77);
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::~unique_ptr
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)0xbadd81);
  return;
}

Assistant:

void RowGroupCollection::AppendRowGroup(SegmentLock &l, idx_t start_row) {
	D_ASSERT(start_row >= row_start);
	auto new_row_group = make_uniq<RowGroup>(*this, start_row, 0U);
	new_row_group->InitializeEmpty(types);
	row_groups->AppendSegment(l, std::move(new_row_group));
}